

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O3

int cfg_schema_validate(cfg_db *db,_Bool cleanup,_Bool ignore_unknown,autobuf *out)

{
  list_entity *plVar1;
  list_entity *plVar2;
  int iVar3;
  avl_node *paVar4;
  char *pcVar5;
  list_entity *plVar6;
  size_t sVar7;
  cfg_schema *pcVar8;
  avl_node *paVar9;
  avl_node *paVar10;
  list_entity *plVar11;
  list_entity *plVar12;
  byte bVar13;
  list_entity *plVar14;
  list_entity *plVar15;
  list_entity *__s;
  list_entity *plVar16;
  byte bVar17;
  bool bVar18;
  bool bVar19;
  char section_name [256];
  avl_node *local_190;
  list_entity *local_148;
  list_entity *local_140;
  char local_138 [264];
  
  pcVar8 = db->schema;
  if (pcVar8 == (cfg_schema *)0x0) {
    iVar3 = -1;
  }
  else {
    plVar12 = (db->sectiontypes).list_head.next;
    if (plVar12->prev == (db->sectiontypes).list_head.prev) {
      bVar13 = 0;
    }
    else {
      bVar13 = 0;
      do {
        plVar11 = plVar12->next;
        local_190 = avl_find(&db->schema->sections,plVar12[3].prev);
        if (local_190 == (avl_node *)0x0) {
          if (!ignore_unknown) {
            cfg_append_printable_line
                      (out,"Cannot find schema for section type \'%s\'",plVar12[3].prev);
            bVar13 = 1;
            if (cleanup) goto LAB_001298b4;
          }
        }
        else {
          paVar4 = avl_find_lessequal(&db->schema->sections,plVar12[3].prev);
          if ((avl_node *)(local_190->list).prev != paVar4) {
            plVar15 = plVar12[5].next;
            do {
              plVar16 = plVar12[4].prev;
              if ((plVar12[4].prev)->prev != plVar15) {
                do {
                  plVar1 = plVar16->next;
                  plVar15 = plVar16[3].prev;
                  if (plVar15 == (list_entity *)0x0) {
                    plVar15 = (list_entity *)0x13b7ba;
                    pcVar5 = "";
LAB_00129644:
                    snprintf(local_138,0x100,"\'%s%s%s\'",plVar12[3].prev,pcVar5,plVar15);
                    plVar15 = (plVar16[4].prev)->prev;
                    plVar14 = plVar16[4].prev;
                    while (plVar15 != plVar16[5].next) {
                      plVar2 = plVar14->next;
                      local_148 = plVar12[3].prev;
                      local_140 = plVar14[3].prev;
                      paVar9 = avl_find(&db->schema->entries,&local_148);
                      if ((paVar9 == (avl_node *)0x0) ||
                         (paVar9 == (avl_node *)&db->schema->entries)) {
                        bVar17 = 0;
                        bVar18 = false;
LAB_001297d5:
                        if (!bVar18 && !ignore_unknown) {
                          cfg_append_printable_line
                                    (out,"Entry \'%s\' in section %s is unknown",plVar14[3].prev,
                                     local_138);
                          bVar17 = 1;
                        }
                      }
                      else {
                        plVar15 = plVar14 + 4;
                        bVar17 = 0;
                        bVar18 = false;
                        paVar10 = paVar9;
                        do {
                          if ((paVar10 != paVar9) && (paVar10->follower != true)) goto LAB_001297d5;
                          if (paVar10[2].list.next != (list_entity *)0x0) {
                            plVar6 = plVar15->next;
                            if (plVar6 != (list_entity *)0x0) {
                              bVar18 = false;
                              __s = plVar6;
                              do {
                                if ((list_entity *)
                                    ((long)&(plVar14[4].prev)->next + (long)&plVar6->next) <= __s)
                                goto LAB_001297b1;
                                if ((!bVar18) &&
                                   (iVar3 = (*(code *)paVar10[2].list.next)
                                                      (paVar10,local_138,__s,out), iVar3 != 0)) {
                                  bVar17 = 1;
                                }
                                if (((bVar17 | bVar18) & cleanup) == 1) {
                                  strarray_remove_ext((strarray *)plVar15,(char *)__s,false);
                                }
                                else {
                                  sVar7 = strlen((char *)__s);
                                  __s = (list_entity *)((long)&__s->next + sVar7 + 1);
                                }
                                if (paVar10[1].balance == '\0') {
                                  bVar18 = true;
                                }
                                plVar6 = plVar15->next;
                              } while (plVar6 != (list_entity *)0x0);
                            }
                            cfg_db_remove_entry(db,(char *)plVar12[3].prev,(char *)plVar16[3].prev,
                                                (char *)plVar14[3].prev);
                          }
LAB_001297b1:
                          paVar10 = (avl_node *)(paVar10->list).next;
                        } while ((paVar10 != (avl_node *)0x0) &&
                                (bVar18 = true, paVar10 != (avl_node *)&db->schema->entries));
                      }
                      bVar13 = bVar13 | bVar17;
                      plVar14 = plVar2;
                      plVar15 = plVar2->prev;
                    }
                    if (((bVar13 == 0) && (local_190[1].right != (avl_node *)0x0)) &&
                       (iVar3 = (*(code *)local_190[1].right)(local_138,plVar16,out), iVar3 != 0)) {
                      bVar13 = 1;
                    }
                  }
                  else {
                    bVar18 = *(int *)&local_190[1].parent == 0;
                    if (bVar18) {
                      cfg_append_printable_line
                                (out,
                                 "The section type \'%s\' has to be used without a name (\'%s\' was given as a name)"
                                 ,plVar12[3].prev,plVar15);
                      plVar15 = plVar16[3].prev;
                    }
                    pcVar5 = strchr((char *)plVar15,0x20);
                    bVar19 = pcVar5 != (char *)0x0;
                    if (bVar19) {
                      cfg_append_printable_line
                                (out,
                                 "The section name \'%s\' for type \'%s\' contains illegal characters"
                                 ,plVar15,plVar12[3].prev);
                    }
                    if ((bVar19 || bVar18) && cleanup) {
                      cfg_db_remove_namedsection(db,(char *)plVar12[3].prev,(char *)plVar16[3].prev)
                      ;
                      bVar13 = (bVar19 || bVar18) | bVar13;
                    }
                    else {
                      bVar13 = bVar13 | (bVar19 || bVar18);
                      if (!bVar19 && !bVar18) {
                        plVar15 = plVar16[3].prev;
                        pcVar5 = "=";
                        goto LAB_00129644;
                      }
                    }
                  }
                  plVar15 = plVar1->prev;
                  plVar16 = plVar1;
                } while (plVar15 != plVar12[5].next);
              }
              local_190 = (avl_node *)(local_190->list).next;
            } while ((avl_node *)(local_190->list).prev != paVar4);
          }
          if ((cleanup) && (*(int *)&plVar12[6].next == 0)) {
LAB_001298b4:
            cfg_db_remove_sectiontype(db,(char *)plVar12[3].prev);
          }
        }
        plVar12 = plVar11;
      } while (plVar11->prev != (db->sectiontypes).list_head.prev);
      pcVar8 = db->schema;
    }
    plVar12 = (pcVar8->sections).list_head.next;
    if (plVar12->prev != (pcVar8->sections).list_head.prev) {
      do {
        paVar4 = avl_find(&db->sectiontypes,plVar12[3].prev);
        if (*(int *)&plVar12[4].prev == 2) {
          if (((paVar4 == (avl_node *)0x0) || (*(int *)&paVar4[1].key == 0)) ||
             (*(int *)&paVar4[1].key == 1 && paVar4[1].parent[1].list.next == (list_entity *)0x0)) {
            cfg_append_printable_line
                      (out,"Missing mandatory section of type \'%s\'",plVar12[3].prev);
            bVar17 = 1;
          }
          else {
            bVar17 = 0;
          }
          bVar13 = bVar13 | bVar17;
        }
        plVar11 = plVar12[9].prev;
        if (plVar11 != (list_entity *)0x0) {
          plVar15 = (list_entity *)0x0;
          do {
            if ((paVar4 != (avl_node *)0x0) &&
               (plVar16 = plVar12[9].next,
               *(long *)((long)plVar16 + (long)plVar15 * 200 + 0x50) == 0)) {
              paVar9 = avl_find((avl_tree *)&paVar4[1].parent,(void *)0x0);
              if ((paVar9 == (avl_node *)0x0) ||
                 (paVar9 = avl_find((avl_tree *)&paVar9[1].parent,
                                    *(void **)((long)plVar16 + (long)plVar15 * 200 + 0x48)),
                 paVar9 == (avl_node *)0x0)) {
                paVar10 = paVar4[1].left;
                for (paVar9 = paVar4[1].parent; (avl_node *)(paVar9->list).prev != paVar10;
                    paVar9 = (avl_node *)(paVar9->list).next) {
                  if (paVar9[1].list.next != (list_entity *)0x0) {
                    paVar10 = avl_find((avl_tree *)&paVar9[1].parent,
                                       *(void **)((long)plVar16 + (long)plVar15 * 200 + 0x48));
                    if (paVar10 == (avl_node *)0x0) {
                      cfg_append_printable_line
                                (out,
                                 "Missing mandatory entry of type \'%s\', name \'%s\' and key \'%s\'"
                                 ,plVar12[3].prev,paVar9[1].list.next,
                                 *(undefined8 *)((long)plVar16 + (long)plVar15 * 200 + 0x48));
                      bVar17 = 1;
                      goto LAB_00129a17;
                    }
                    paVar10 = paVar4[1].left;
                  }
                }
                bVar17 = 0;
              }
              else {
                bVar17 = 0;
              }
LAB_00129a17:
              bVar13 = bVar13 | bVar17;
              plVar11 = plVar12[9].prev;
            }
            plVar15 = (list_entity *)((long)&plVar15->next + 1);
          } while (plVar15 < plVar11);
        }
        plVar12 = plVar12->next;
      } while (plVar12->prev != (db->schema->sections).list_head.prev);
    }
    iVar3 = -(uint)bVar13;
  }
  return iVar3;
}

Assistant:

int
cfg_schema_validate(struct cfg_db *db, bool cleanup, bool ignore_unknown, struct autobuf *out) {
  char section_name[256];
  struct cfg_section_type *section, *section_it;
  struct cfg_named_section *named, *named_it;
  struct cfg_entry *entry, *entry_it;

  struct cfg_schema_section *schema_section;
  struct cfg_schema_section *schema_section_first, *schema_section_last;
  struct cfg_schema_entry *schema_entry;
  size_t i;

  bool error = false;
  bool warning = false;
  bool hasName = false;

  if (db->schema == NULL) {
    return -1;
  }

  CFG_FOR_ALL_SECTION_TYPES(db, section, section_it) {
    /* check for missing schema sections */
    schema_section_first = avl_find_element(&db->schema->sections, section->type, schema_section_first, _section_node);

    if (schema_section_first == NULL) {
      if (ignore_unknown) {
        continue;
      }

      cfg_append_printable_line(out, "Cannot find schema for section type '%s'", section->type);

      if (cleanup) {
        cfg_db_remove_sectiontype(db, section->type);
      }

      error |= true;
      continue;
    }

    schema_section_last = avl_find_le_element(&db->schema->sections, section->type, schema_section_last, _section_node);

    /* iterate over all schema for a certain section type */
    avl_for_element_range(schema_section_first, schema_section_last, schema_section, _section_node) {
      /* check data of named sections in db */
      CFG_FOR_ALL_SECTION_NAMES(section, named, named_it) {
        warning = false;
        hasName = cfg_db_is_named_section(named);

        if (hasName) {
          if (schema_section->mode == CFG_SSMODE_UNNAMED) {
            cfg_append_printable_line(out,
              "The section type '%s'"
              " has to be used without a name"
              " ('%s' was given as a name)",
              section->type, named->name);

            warning = true;
          }
        }

        if (hasName && !cfg_is_allowed_section_name(named->name)) {
          cfg_append_printable_line(out,
            "The section name '%s' for"
            " type '%s' contains illegal characters",
            named->name, section->type);
          warning = true;
        }

        /* test abort condition */
        if (warning && cleanup) {
          /* remove bad named section */
          cfg_db_remove_namedsection(db, section->type, named->name);
        }

        error |= warning;

        if (warning) {
          continue;
        }

        /* initialize section_name field for validate */
        snprintf(section_name, sizeof(section_name), "'%s%s%s'", section->type, hasName ? "=" : "",
          hasName ? named->name : "");

        /* check for bad values */
        CFG_FOR_ALL_ENTRIES(named, entry, entry_it) {
          warning = _validate_cfg_entry(db, section, named, entry, section_name, cleanup, ignore_unknown, out);
          error |= warning;
        }

        /* check custom section validation if everything was fine */
        if (!error && schema_section->cb_validate != NULL) {
          if (schema_section->cb_validate(section_name, named, out)) {
            error = true;
          }
        }
      }
    }
    if (cleanup && avl_is_empty(&section->names)) {
      /* if section type is empty, remove it too */
      cfg_db_remove_sectiontype(db, section->type);
    }
  }

  avl_for_each_element(&db->schema->sections, schema_section, _section_node) {
    section = cfg_db_find_sectiontype(db, schema_section->type);
    if (schema_section->mode == CFG_SSMODE_NAMED_MANDATORY) {
      /* search for missing mandatory sections */
      if (section == NULL || avl_is_empty(&section->names)) {
        warning = true;
      }
      else {
        named = avl_first_element(&section->names, named, node);
        warning = !cfg_db_is_named_section(named) && section->names.count < 2;
      }
      if (warning) {
        cfg_append_printable_line(out, "Missing mandatory section of type '%s'", schema_section->type);
      }
      error |= warning;
    }

    /* check for missing values */
    for (i = 0; i < schema_section->entry_count; i++) {
      schema_entry = &schema_section->entries[i];
      if (section && strarray_is_empty_c(&schema_entry->def)) {
        /* found a mandatory schema entry */

        warning = true;
        named = cfg_db_get_unnamed_section(section);
        if (named) {
          /* entry not in unnamed section */
          warning = cfg_db_get_entry(named, schema_entry->key.entry) == NULL;
        }
        if (warning) {
          /* no mandatory value in unnamed section, check named sections */
          warning = false;

          avl_for_each_element(&section->names, named, node) {
            if (named->name != NULL && cfg_db_get_entry(named, schema_entry->key.entry) == NULL) {
              /* found a named section without mandatory entry */
              warning = true;
              cfg_append_printable_line(
                out, "Missing mandatory entry of type '%s', name '%s' and key '%s'",
                schema_section->type, named->name, schema_entry->key.entry);
              break;
            }
          }
        }
        error |= warning;
      }
    }
  }
  return error ? -1 : 0;
}